

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

ostream * CLI::detail::format_help(ostream *out,string *name,string *description,size_t wid)

{
  char cVar1;
  long lVar2;
  pointer pcVar3;
  ostream *poVar4;
  long lVar5;
  size_type sVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"  ",name);
  ::std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  lVar2 = *(long *)out;
  lVar5 = (long)(int)wid;
  *(long *)(out + *(long *)(lVar2 + -0x18) + 0x10) = lVar5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x20;
  ::std::operator<<(out,(string *)name);
  sVar7 = description->_M_string_length;
  if (sVar7 != 0) {
    if (wid <= name->_M_string_length) {
      poVar4 = ::std::operator<<(out,"\n");
      *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = lVar5;
      ::std::operator<<(poVar4,"");
      sVar7 = description->_M_string_length;
    }
    pcVar3 = (description->_M_dataplus)._M_p;
    for (sVar6 = 0; sVar7 != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = pcVar3[sVar6];
      ::std::ostream::put((char)out);
      if (cVar1 == '\n') {
        *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = lVar5;
        ::std::operator<<(out,"");
      }
    }
  }
  ::std::operator<<(out,"\n");
  return out;
}

Assistant:

inline std::ostream &format_help(std::ostream &out, std::string name, std::string description, std::size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << "\n" << std::setw(static_cast<int>(wid)) << "";
        for(const char c : description) {
            out.put(c);
            if(c == '\n') {
                out << std::setw(static_cast<int>(wid)) << "";
            }
        }
    }
    out << "\n";
    return out;
}